

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O3

int Abc_NtkCleanupNodes(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots,int fVerbose)

{
  Abc_Obj_t **ppNodes;
  ulong uVar1;
  uint uVar2;
  uint *__ptr;
  void *pvVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __size;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x1fc,"int Abc_NtkCleanupNodes(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[1] = 0;
  pvVar3 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar3;
  pVVar5 = pNtk->vCos;
  if (pVVar5->nSize < 1) {
    uVar11 = 0;
    uVar8 = 1000;
  }
  else {
    __size = 0;
    uVar11 = 0;
    uVar7 = 1000;
    uVar1 = 0;
    do {
      uVar8 = uVar1;
      pvVar3 = pVVar5->pArray[uVar11];
      iVar6 = (int)uVar8;
      if ((int)uVar11 == (int)uVar7) {
        pvVar4 = *(void **)(__ptr + 2);
        if (uVar11 < 0x10) {
          if (pvVar4 == (void *)0x0) {
            pvVar4 = malloc(0x80);
          }
          else {
            pvVar4 = realloc(pvVar4,0x80);
          }
          *(void **)(__ptr + 2) = pvVar4;
          uVar8 = 0x10;
        }
        else {
          if (pvVar4 == (void *)0x0) {
            pvVar4 = malloc(__size);
          }
          else {
            pvVar4 = realloc(pvVar4,__size);
          }
          *(void **)(__ptr + 2) = pvVar4;
        }
      }
      else {
        pvVar4 = *(void **)(__ptr + 2);
        uVar8 = uVar7;
      }
      *(void **)((long)pvVar4 + uVar11 * 8) = pvVar3;
      uVar11 = uVar11 + 1;
      pVVar5 = pNtk->vCos;
      __size = __size + 0x10;
      uVar7 = uVar8;
      uVar1 = (ulong)(iVar6 + 2);
    } while ((long)uVar11 < (long)pVVar5->nSize);
  }
  iVar10 = (int)uVar11;
  iVar6 = vRoots->nSize;
  if (0 < iVar6) {
    lVar9 = 0;
    do {
      pvVar3 = vRoots->pArray[lVar9];
      if (pvVar3 != (void *)0x0) {
        iVar10 = (int)uVar11;
        iVar6 = (int)uVar8;
        if (iVar10 == iVar6) {
          if (iVar6 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(0x80);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = 0x10;
            uVar8 = 0x10;
          }
          else {
            uVar8 = (ulong)(uint)(iVar6 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(uVar8 * 8);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),uVar8 * 8);
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = iVar6 * 2;
          }
        }
        else {
          pvVar4 = *(void **)(__ptr + 2);
        }
        uVar11 = (ulong)(iVar10 + 1);
        *(void **)((long)pvVar4 + (long)iVar10 * 8) = pvVar3;
        iVar6 = vRoots->nSize;
      }
      iVar10 = (int)uVar11;
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar6);
  }
  ppNodes = *(Abc_Obj_t ***)(__ptr + 2);
  pVVar5 = Abc_NtkDfsNodes(pNtk,ppNodes,iVar10);
  if (ppNodes != (Abc_Obj_t **)0x0) {
    free(ppNodes);
  }
  free(__ptr);
  uVar2 = Abc_NtkReduceNodes(pNtk,pVVar5);
  if (fVerbose != 0) {
    printf("Cleanup removed %d dangling nodes.\n",(ulong)uVar2);
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  return uVar2;
}

Assistant:

int Abc_NtkCleanupNodes( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots, int fVerbose )
{
    Vec_Ptr_t * vNodes, * vStarts;
    Abc_Obj_t * pObj;
    int i, Counter;
    assert( Abc_NtkIsLogic(pNtk) );
    // collect starting nodes into one array
    vStarts = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vStarts, pObj );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
        if ( pObj )
            Vec_PtrPush( vStarts, pObj );
    // mark the nodes reachable from the POs
    vNodes = Abc_NtkDfsNodes( pNtk, (Abc_Obj_t **)Vec_PtrArray(vStarts), Vec_PtrSize(vStarts) );
    Vec_PtrFree( vStarts );
    Counter = Abc_NtkReduceNodes( pNtk, vNodes );
    if ( fVerbose )
        printf( "Cleanup removed %d dangling nodes.\n", Counter );
    Vec_PtrFree( vNodes );
    return Counter;
}